

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

void __thiscall
ON_3dmAnnotationSettings::ON_3dmAnnotationSettings
          (ON_3dmAnnotationSettings *this,ON_3dmAnnotationSettings *src)

{
  ON_3dmAnnotationSettings *src_local;
  ON_3dmAnnotationSettings *this_local;
  
  this->m_dimscale = 1.0;
  this->m_textheight = 1.0;
  this->m_dimexe = 1.0;
  this->m_dimexo = 1.0;
  this->m_arrowlength = 1.0;
  this->m_arrowwidth = 1.0;
  this->m_centermark = 1.0;
  this->m_private = (ON_3dmAnnotationSettingsPrivate *)0x0;
  this->m_b_V5_EnableAnnotationScaling = '\x01';
  this->m_bEnableModelSpaceAnnotationScaling = '\x01';
  this->m_bEnableLayoutSpaceAnnotationScaling = '\x01';
  this->m_bEnableHatchScaling = '\x01';
  this->m_reserved1 = 0;
  this->m_reserved2 = '\0';
  this->m_reserved3 = '\0';
  this->m_reserved4 = '\0';
  this->m_dimunits = None;
  this->m_arrowtype = 0;
  this->m_angularunits = 0;
  this->m_lengthformat = 0;
  this->m_angleformat = 0;
  this->m_resolution = 0;
  ON_wString::ON_wString(&this->m_facename);
  Internal_CopyFrom(this,src);
  return;
}

Assistant:

ON_3dmAnnotationSettings::ON_3dmAnnotationSettings(const ON_3dmAnnotationSettings& src)
{
  Internal_CopyFrom(src);
}